

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.hpp
# Opt level: O2

void re::math::normalize<float,256l,256l>(span<const_float,_256L> in,span<float,_256L> out)

{
  anon_class_4_1_ba1d79ab __unary_op;
  span<float,_256L> out_local;
  span<const_float,_256L> in_local;
  span_iterator<gsl::span<const_float,_256L>,_false> local_68;
  undefined1 *local_58;
  undefined8 local_50;
  span_iterator<gsl::span<float,_256L>,_false> local_48;
  span_iterator<gsl::span<const_float,_256L>,_false> local_38;
  span<const_float,_256L> *local_28;
  undefined8 local_20;
  span<const_float,_256L> *local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_20 = 0x100;
  out_local = out;
  in_local = in;
  local_28 = &in_local;
  local_18 = &in_local;
  __unary_op.sum =
       ::std::
       accumulate<gsl::details::span_iterator<gsl::span<float_const,256l>,false>,float,re::math::normalize<float,256l,256l>(gsl::span<float_const,256l>,gsl::span<float,256l>)::_lambda(auto:1,auto:2)_1_>
                 ();
  if (0.0 <= __unary_op.sum) {
    local_38.index_ = 0;
    local_48.index_ = 0x100;
    local_50 = 0;
    local_58 = (undefined1 *)&out_local;
    local_48.span_ = (span<float,_256L> *)&in_local;
    local_38.span_ = &in_local;
    ::std::
    transform<gsl::details::span_iterator<gsl::span<float_const,256l>,false>,gsl::details::span_iterator<gsl::span<float,256l>,false>,re::math::normalize<float,256l,256l>(gsl::span<float_const,256l>,gsl::span<float,256l>)::_lambda(auto:1)_1_>
              (&local_68,&local_38,&local_48,__unary_op);
    return;
  }
  __assert_fail("sum >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/normalize.hpp"
                ,0x1a,
                "void re::math::normalize(gsl::span<const T, N_in>, gsl::span<T, N_out>) [T = float, N_in = 256L, N_out = 256L]"
               );
}

Assistant:

void
normalize(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    assert(std::size(in) == std::size(out));
    auto sum = std::accumulate(
        std::cbegin(in),
        std::cend(in),
        static_cast<T>(0),
        [] (const auto result, const auto value) {
            return result + std::fmax(value, 0);
        }
    );

    assert(sum >= 0);
    std::transform(
        std::cbegin(in),
        std::cend(in),
        std::begin(out),
        [sum] (auto v) {
            return v / sum;
        }
    );
}